

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::PrintOffset
          (JsonPrinter *this,void *val,Type *type,int indent,uint8_t *prev_val,
          soffset_t vector_index)

{
  bool bVar1;
  EnumVal *pEVar2;
  char *pcVar3;
  Container *arr;
  BaseType local_40 [3];
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  uint16_t local_28;
  
  while (type->base_type == BASE_TYPE_UNION) {
    if ((uint *)prev_val == (uint *)0x0) {
      __assert_fail("prev_val",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0xb9,
                    "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                   );
    }
    if (-1 < vector_index) {
      if (*(uint *)((long)prev_val + (ulong)*(uint *)prev_val) <= (uint)vector_index) {
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,
                      "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                     );
      }
      prev_val = (uint8_t *)
                 ((long)prev_val + (ulong)(uint)vector_index + (ulong)*(uint *)prev_val + 4);
    }
    pEVar2 = EnumDef::ReverseLookup(type->enum_def,(ulong)(byte)*(uint *)prev_val,true);
    if (pEVar2 == (EnumVal *)0x0) {
      return "unknown enum value";
    }
    vector_index = 0xffffffff;
    prev_val = (uint8_t *)0x0;
    type = &pEVar2->union_type;
  }
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    bVar1 = EscapeString((char *)((long)val + 4),(ulong)*val,this->text,this->opts->allow_non_utf8,
                         this->opts->natural_utf8);
    if (bVar1) {
      return (char *)0x0;
    }
    return "string contains non-utf8 bytes";
  case BASE_TYPE_VECTOR:
    break;
  case BASE_TYPE_STRUCT:
    pcVar3 = GenStruct(this,type->struct_def,(Table *)val,indent);
    return pcVar3;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0xf3,
                  "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                 );
  case BASE_TYPE_ARRAY:
    local_40[0] = type->element;
    local_40[2] = *(BaseType *)&type->struct_def;
    uStack_34 = *(undefined4 *)((long)&type->struct_def + 4);
    uStack_30 = *(undefined4 *)&type->enum_def;
    uStack_2c = *(undefined4 *)((long)&type->enum_def + 4);
    local_28 = type->fixed_length;
    local_40[1] = 0;
    switch(local_40[0]) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      pcVar3 = PrintContainer<flatbuffers::Array<unsigned_char,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_CHAR:
      pcVar3 = PrintContainer<flatbuffers::Array<signed_char,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_SHORT:
      pcVar3 = PrintContainer<flatbuffers::Array<short,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_USHORT:
      pcVar3 = PrintContainer<flatbuffers::Array<unsigned_short,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_INT:
      pcVar3 = PrintContainer<flatbuffers::Array<int,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_UINT:
      pcVar3 = PrintContainer<flatbuffers::Array<unsigned_int,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_LONG:
      pcVar3 = PrintContainer<flatbuffers::Array<long,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_ULONG:
      pcVar3 = PrintContainer<flatbuffers::Array<unsigned_long,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_FLOAT:
      pcVar3 = PrintContainer<flatbuffers::Array<float,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_DOUBLE:
      pcVar3 = PrintContainer<flatbuffers::Array<double,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      pcVar3 = PrintContainer<flatbuffers::Array<flatbuffers::Offset<void>,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    case BASE_TYPE_ARRAY:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0xee,
                    "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                   );
    case BASE_TYPE_VECTOR64:
      pcVar3 = PrintContainer<flatbuffers::Array<flatbuffers::Offset64<void>,(unsigned_short)65535>,unsigned_short>
                         (this,val,local_28,local_40,indent,0);
      break;
    default:
      goto switchD_00146e68_default;
    }
    goto LAB_00147164;
  }
  local_40[0] = type->element;
  local_40[2] = *(BaseType *)&type->struct_def;
  uStack_34 = *(undefined4 *)((long)&type->struct_def + 4);
  uStack_30 = *(undefined4 *)&type->enum_def;
  uStack_2c = *(undefined4 *)((long)&type->enum_def + 4);
  local_28 = type->fixed_length;
  local_40[1] = 0;
  switch(local_40[0]) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_BOOL:
  case BASE_TYPE_UCHAR:
    pcVar3 = PrintContainer<flatbuffers::Vector<unsigned_char,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_CHAR:
    pcVar3 = PrintContainer<flatbuffers::Vector<signed_char,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_SHORT:
    pcVar3 = PrintContainer<flatbuffers::Vector<short,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_USHORT:
    pcVar3 = PrintContainer<flatbuffers::Vector<unsigned_short,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_ARRAY:
    pcVar3 = PrintContainer<flatbuffers::Vector<int,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_UINT:
    pcVar3 = PrintContainer<flatbuffers::Vector<unsigned_int,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_LONG:
    pcVar3 = PrintContainer<flatbuffers::Vector<long,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_ULONG:
    pcVar3 = PrintContainer<flatbuffers::Vector<unsigned_long,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_FLOAT:
    pcVar3 = PrintContainer<flatbuffers::Vector<float,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_DOUBLE:
    pcVar3 = PrintContainer<flatbuffers::Vector<double,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_STRING:
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_STRUCT:
  case BASE_TYPE_UNION:
    pcVar3 = PrintContainer<flatbuffers::Vector<flatbuffers::Offset<void>,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  case BASE_TYPE_VECTOR64:
    pcVar3 = PrintContainer<flatbuffers::Vector<flatbuffers::Offset64<void>,unsigned_int>,unsigned_int>
                       (this,val,*val,local_40,indent,prev_val);
    break;
  default:
    goto switchD_00146e68_default;
  }
LAB_00147164:
  if (pcVar3 == (char *)0x0) {
switchD_00146e68_default:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char *PrintOffset(const void *val, const Type &type, int indent,
                          const uint8_t *prev_val, soffset_t vector_index) {
    switch (type.base_type) {
      case BASE_TYPE_UNION: {
        // If this assert hits, you have an corrupt buffer, a union type field
        // was not present or was out of range.
        FLATBUFFERS_ASSERT(prev_val);
        auto union_type_byte = *prev_val;  // Always a uint8_t.
        if (vector_index >= 0) {
          auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(
              prev_val + ReadScalar<uoffset_t>(prev_val));
          union_type_byte = type_vec->Get(static_cast<uoffset_t>(vector_index));
        }
        auto enum_val = type.enum_def->ReverseLookup(union_type_byte, true);
        if (enum_val) {
          return PrintOffset(val, enum_val->union_type, indent, nullptr, -1);
        } else {
          return "unknown enum value";
        }
      }
      case BASE_TYPE_STRUCT:
        return GenStruct(*type.struct_def, reinterpret_cast<const Table *>(val),
                         indent);
      case BASE_TYPE_STRING: {
        auto s = reinterpret_cast<const String *>(val);
        bool ok = EscapeString(s->c_str(), s->size(), &text,
                               opts.allow_non_utf8, opts.natural_utf8);
        return ok ? nullptr : "string contains non-utf8 bytes";
      }
      case BASE_TYPE_VECTOR: {
        const auto vec_type = type.VectorType();
        // Call PrintVector above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintVector<CTYPE>(val, vec_type, indent, prev_val); \
            if (err) return err; \
            break; }
          FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        }
        // clang-format on
        return nullptr;
      }
      case BASE_TYPE_ARRAY: {
        const auto vec_type = type.VectorType();
        // Call PrintArray above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintArray<CTYPE>(val, type.fixed_length, vec_type, indent); \
            if (err) return err; \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
              // Arrays of scalars or structs are only possible.
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
          case BASE_TYPE_ARRAY: FLATBUFFERS_ASSERT(0);
        }
        // clang-format on
        return nullptr;
      }
      default: FLATBUFFERS_ASSERT(0); return "unknown type";
    }
  }